

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

const_iterator __thiscall
duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::Scan
          (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *this)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  iterator i;
  iterator highest_frequency;
  unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_18;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false> local_8;
  
  local_20._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_18._M_cur = local_20._M_cur;
  do {
    local_28._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar2 = ::std::__detail::operator!=(&local_20,&local_28);
    if (!bVar2) {
      ::std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
      _Node_const_iterator
                (in_stack_ffffffffffffffc0,
                 (_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false> *)
                 in_stack_ffffffffffffffb8);
      return (const_iterator)
             (_Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false>)
             local_8._M_cur;
    }
    ppVar3 = ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                         *)0x1df7560);
    uVar1 = (ppVar3->second).count;
    ppVar3 = ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                         *)0x1df7573);
    if ((ppVar3->second).count < uVar1) {
LAB_01df75d5:
      local_18._M_cur = local_20._M_cur;
    }
    else {
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                           *)0x1df758b);
      in_stack_ffffffffffffffc0 =
           (_Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false> *)
           (ppVar3->second).count;
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                           *)0x1df759e);
      if (in_stack_ffffffffffffffc0 ==
          (_Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false> *)
          (ppVar3->second).count) {
        ppVar3 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                             *)0x1df75b6);
        in_stack_ffffffffffffffb8 =
             (unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
              *)(ppVar3->second).first_row;
        ppVar3 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                             *)0x1df75c8);
        if (in_stack_ffffffffffffffb8 <
            (unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
             *)(ppVar3->second).first_row) goto LAB_01df75d5;
      }
    }
    ::std::__detail::_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false> *)
                 in_stack_ffffffffffffffc0);
  } while( true );
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}